

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triangle.h
# Opt level: O3

pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *
anurbs::Triangle<3L>::closest_point(Vector *point,Vector *a,Vector *b,Vector *c)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *in_RDI;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  
  dVar4 = (b->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
          [0];
  dVar5 = (b->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
          [1];
  dVar6 = (a->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
          [0];
  dVar7 = (a->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
          [1];
  dVar12 = dVar4 - dVar6;
  dVar13 = dVar5 - dVar7;
  dVar1 = (b->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
          [2];
  dVar2 = (a->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
          [2];
  dVar16 = dVar1 - dVar2;
  dVar8 = (c->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
          [0];
  dVar9 = (c->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
          [1];
  dVar14 = dVar8 - dVar6;
  dVar15 = dVar9 - dVar7;
  dVar3 = (c->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
          [2];
  dVar10 = (point->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
           array[0] - dVar6;
  dVar11 = (point->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
           array[1] - dVar7;
  dVar20 = dVar3 - dVar2;
  dVar22 = (point->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
           array[2] - dVar2;
  dVar21 = dVar20 * dVar13 - dVar15 * dVar16;
  dVar23 = dVar14 * dVar16 - dVar20 * dVar12;
  dVar17 = dVar15 * dVar12 + -dVar13 * dVar14;
  dVar24 = dVar17 * dVar17 + dVar23 * dVar23 + dVar21 * dVar21;
  auVar18._0_8_ =
       dVar17 * (dVar10 * dVar15 - dVar14 * dVar11) +
       (dVar14 * dVar22 - dVar10 * dVar20) * dVar23 + (dVar11 * dVar20 - dVar22 * dVar15) * dVar21;
  auVar18._8_8_ =
       dVar17 * (dVar12 * dVar11 - dVar10 * dVar13) +
       (dVar16 * dVar10 - dVar22 * dVar12) * dVar23 + (dVar13 * dVar22 - dVar11 * dVar16) * dVar21;
  auVar19._8_8_ = dVar24;
  auVar19._0_8_ = dVar24;
  auVar19 = divpd(auVar18,auVar19);
  dVar12 = auVar19._8_8_;
  dVar11 = auVar19._0_8_;
  dVar10 = (1.0 - dVar12) - dVar11;
  (in_RDI->first).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
  array[0] = dVar10;
  *(undefined1 (*) [16])
   ((in_RDI->first).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
    array + 1) = auVar19;
  (in_RDI->second).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
  array[0] = dVar8 * dVar12 + dVar11 * dVar4 + dVar10 * dVar6;
  (in_RDI->second).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
  array[1] = dVar9 * dVar12 + dVar11 * dVar5 + dVar10 * dVar7;
  (in_RDI->second).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
  array[2] = dVar12 * dVar3 + dVar1 * dVar11 + dVar2 * dVar10;
  return in_RDI;
}

Assistant:

static std::pair<Parameter, Vector> closest_point(Vector point, Vector a, Vector b, Vector c)
    {
        Vector u = b - a;
        Vector v = c - a;
        Vector n = u.cross(v);
        Vector w = point - a;

        double r = u.cross(w).dot(n) / n.dot(n);
        double s = w.cross(v).dot(n) / n.dot(n);
        double t = 1.0 - r - s;

        Vector closest_point = t * a + s * b + r * c;

        return {Parameter(t, s, r), closest_point};
    }